

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubMethods
          (ServiceGenerator *this,Printer *printer)

{
  long lVar1;
  ServiceDescriptor *pSVar2;
  mapped_type *pmVar3;
  undefined1 qualified;
  _Rb_tree_header *p_Var4;
  int extraout_EDX;
  int extraout_EDX_00;
  int i;
  long lVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sub_vars;
  string local_b8;
  key_type local_98;
  protobuf *local_78;
  ServiceGenerator *local_70;
  Printer *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pSVar2 = this->descriptor_;
  if (0 < *(int *)(pSVar2 + 0x20)) {
    lVar5 = 0x20;
    local_78 = (protobuf *)0x0;
    local_70 = this;
    local_68 = printer;
    do {
      lVar1 = *(long *)(pSVar2 + 0x28);
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var4 = &local_60._M_impl.super__Rb_tree_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"classname","");
      qualified = SUB81(p_Var4,0);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&local_b8);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"name","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&local_b8);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      i = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        i = extraout_EDX_00;
      }
      SimpleItoa_abi_cxx11_(&local_b8,local_78,i);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"index","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&local_98);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      ClassName_abi_cxx11_
                (&local_b8,*(cpp **)(lVar1 + -8 + lVar5),(Descriptor *)0x1,(bool)qualified);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"input_type","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&local_98);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      ClassName_abi_cxx11_(&local_b8,*(cpp **)(lVar1 + lVar5),(Descriptor *)0x1,(bool)qualified);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"output_type","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,&local_98);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(local_68,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_60,
                         "void $classname$_Stub::$name$(::google::protobuf::RpcController* controller,\n                              const $input_type$* request,\n                              $output_type$* response,\n                              ::google::protobuf::Closure* done) {\n  channel_->CallMethod(descriptor()->method($index$),\n                       controller, request, response, done);\n}\n"
                        );
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      local_78 = local_78 + 1;
      pSVar2 = local_70->descriptor_;
      lVar5 = lVar5 + 0x30;
    } while ((long)local_78 < (long)*(int *)(pSVar2 + 0x20));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateStubMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    map<string, string> sub_vars;
    sub_vars["classname"] = descriptor_->name();
    sub_vars["name"] = method->name();
    sub_vars["index"] = SimpleItoa(i);
    sub_vars["input_type"] = ClassName(method->input_type(), true);
    sub_vars["output_type"] = ClassName(method->output_type(), true);

    printer->Print(sub_vars,
      "void $classname$_Stub::$name$(::google::protobuf::RpcController* controller,\n"
      "                              const $input_type$* request,\n"
      "                              $output_type$* response,\n"
      "                              ::google::protobuf::Closure* done) {\n"
      "  channel_->CallMethod(descriptor()->method($index$),\n"
      "                       controller, request, response, done);\n"
      "}\n");
  }
}